

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

PAL_ERROR CorUnix::InternalMapViewOfFile
                    (CPalThread *pThread,HANDLE hFileMappingObject,DWORD dwDesiredAccess,
                    DWORD dwFileOffsetHigh,DWORD dwFileOffsetLow,SIZE_T dwNumberOfBytesToMap,
                    LPVOID *ppvBaseAddress)

{
  uint uVar1;
  PAL_ERROR PVar2;
  int __flags;
  PAL_ERROR PVar3;
  int iVar4;
  CFileMappingProcessLocalData *pCVar5;
  _LIST_ENTRY *p_Var6;
  int *piVar7;
  char *__format;
  int __fd;
  long local_58;
  CFileMappingImmutableData *pImmutableData;
  IDataLock *pProcessLocalDataLock;
  CFileMappingProcessLocalData *pProcessLocalData;
  _LIST_ENTRY *local_38;
  IPalObject *pMappingObject;
  
  local_38 = (_LIST_ENTRY *)0x0;
  local_58 = 0;
  pProcessLocalDataLock = (IDataLock *)0x0;
  pImmutableData = (CFileMappingImmutableData *)0x0;
  PVar2 = 0x57;
  if ((6 < dwDesiredAccess) || ((0x56U >> (dwDesiredAccess & 0x1f) & 1) == 0)) {
    fprintf(_stderr,"] %s %s:%d","InternalMapViewOfFile",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x48a);
    __format = 
    "dwDesiredAccess can be one of FILE_MAP_WRITE, FILE_MAP_READ, FILE_MAP_COPY or FILE_MAP_ALL_ACCESS.\n"
    ;
LAB_0012d8c7:
    fprintf(_stderr,__format);
    PVar3 = PVar2;
    goto LAB_0012d8ce;
  }
  if (dwFileOffsetLow != 0 || dwFileOffsetHigh != 0) {
    fprintf(_stderr,"] %s %s:%d","InternalMapViewOfFile",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x491);
    __format = "dwFileOffsetHigh and dwFileOffsetLow are always 0.\n";
    goto LAB_0012d8c7;
  }
  PVar3 = (**(code **)(*g_pObjectManager + 0x28))
                    (g_pObjectManager,pThread,hFileMappingObject,&aotFileMapping,dwDesiredAccess);
  if (((PVar3 != 0) || (PVar3 = (*(code *)local_38->Flink[1].Flink)(local_38,&local_58), PVar3 != 0)
      ) || (PVar3 = (*(code *)local_38->Flink[1].Blink)
                              (local_38,pThread,0,&pImmutableData,&pProcessLocalDataLock),
           PVar3 != 0)) {
    if (PAL_InitializeChakraCoreCalled != false) goto LAB_0012d8ce;
    goto LAB_0012db65;
  }
  if (dwNumberOfBytesToMap == 0) {
    dwNumberOfBytesToMap = (SIZE_T)*(uint *)(local_58 + 0x1000);
  }
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012db65;
  iVar4 = *(int *)(local_58 + 0x1004);
  PVar3 = PVar2;
  if (((dwDesiredAccess != 4 && iVar4 == 2) || (dwDesiredAccess == 2 && iVar4 != 4)) ||
     (dwDesiredAccess == 1 && iVar4 != 8)) goto LAB_0012d8ce;
  uVar1 = *(uint *)(local_58 + 0x100c);
  PVar3 = 5;
  if (((dwDesiredAccess == 4) && ((uVar1 | 2) != 6)) ||
     ((((dwDesiredAccess & 2) != 0 && ((uVar1 & 0xfffffffb) != 2)) ||
      (dwDesiredAccess == 1 && uVar1 != 1)))) goto LAB_0012d8ce;
  InternalEnterCriticalSection(pThread,&mapping_critsec);
  switch(dwDesiredAccess) {
  case 1:
    __fd = *(int *)&pProcessLocalDataLock->_vptr_IDataLock;
    iVar4 = 3;
    __flags = 2;
    goto LAB_0012da14;
  case 2:
  case 6:
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012db65;
    iVar4 = 3;
    break;
  default:
    fprintf(_stderr,"] %s %s:%d","MAPFileMapToMmapFlags",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x6cb);
    fprintf(_stderr,"Unknown flag. This line should not have been executed.\n");
    fprintf(_stderr,"] %s %s:%d","InternalMapViewOfFile",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x537);
    fprintf(_stderr,"MapFileMapToMmapFlags failed!\n");
    PVar3 = 0x54f;
    goto LAB_0012db4a;
  case 4:
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012db65;
    iVar4 = 1;
  }
  __fd = *(int *)&pProcessLocalDataLock->_vptr_IDataLock;
  __flags = 1;
LAB_0012da14:
  pCVar5 = (CFileMappingProcessLocalData *)
           mmap64((void *)0x0,dwNumberOfBytesToMap,iVar4,__flags,__fd,0);
  if (pCVar5 == (CFileMappingProcessLocalData *)0xffffffffffffffff) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012db65;
    piVar7 = __errno_location();
    strerror(*piVar7);
    PVar3 = 8;
  }
  else {
    pProcessLocalData = pCVar5;
    p_Var6 = (_LIST_ENTRY *)InternalMalloc(0x38);
    if (p_Var6 == (_LIST_ENTRY *)0x0) {
      iVar4 = munmap(pProcessLocalData,dwNumberOfBytesToMap);
      PVar3 = 0x54f;
      PVar2 = 0x54f;
      if (iVar4 == -1) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012db65;
        goto LAB_0012db4a;
      }
    }
    else {
      p_Var6[1].Blink = (_LIST_ENTRY *)pProcessLocalData;
      p_Var6[2].Flink = (_LIST_ENTRY *)dwNumberOfBytesToMap;
      *(DWORD *)&p_Var6[2].Blink = dwDesiredAccess;
      p_Var6[1].Flink = local_38;
      (*(code *)local_38->Flink[3].Blink)();
      p_Var6[3].Flink = (_LIST_ENTRY *)0x0;
      p_Var6->Flink = &MappedViewList;
      p_Var6->Blink = MappedViewList.Blink;
      (MappedViewList.Blink)->Flink = p_Var6;
      PVar2 = 0;
      MappedViewList.Blink = p_Var6;
    }
    PVar3 = PVar2;
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_0012db65:
      abort();
    }
    *ppvBaseAddress = pProcessLocalData;
  }
LAB_0012db4a:
  InternalLeaveCriticalSection(pThread,&mapping_critsec);
LAB_0012d8ce:
  if (pImmutableData != (CFileMappingImmutableData *)0x0) {
    (*(code *)**(undefined8 **)pImmutableData->szFileName)(pImmutableData,pThread,0);
  }
  if (local_38 != (_LIST_ENTRY *)0x0) {
    (*(code *)local_38->Flink[4].Flink)(local_38,pThread);
  }
  return PVar3;
}

Assistant:

PAL_ERROR
CorUnix::InternalMapViewOfFile(
    CPalThread *pThread,
    HANDLE hFileMappingObject,
    DWORD dwDesiredAccess,
    DWORD dwFileOffsetHigh,
    DWORD dwFileOffsetLow,
    SIZE_T dwNumberOfBytesToMap,
    LPVOID *ppvBaseAddress
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pMappingObject = NULL;
    CFileMappingImmutableData *pImmutableData = NULL;
    CFileMappingProcessLocalData *pProcessLocalData = NULL;
    IDataLock *pProcessLocalDataLock = NULL;
#if ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
    PMAPPED_VIEW_LIST pReusedMapping = NULL;
#endif
    LPVOID pvBaseAddress = NULL;

    /* Sanity checks */
    if ( MAPContainsInvalidFlags( dwDesiredAccess ) )
    {
        ASSERT( "dwDesiredAccess can be one of FILE_MAP_WRITE, FILE_MAP_READ,"
               " FILE_MAP_COPY or FILE_MAP_ALL_ACCESS.\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto InternalMapViewOfFileExit;
    }

    if ( 0 != dwFileOffsetHigh || 0 != dwFileOffsetLow )
    {
        ASSERT( "dwFileOffsetHigh and dwFileOffsetLow are always 0.\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto InternalMapViewOfFileExit;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFileMappingObject,
        &aotFileMapping,
        dwDesiredAccess,
        &pMappingObject
        );

    if (NO_ERROR != palError)
    {
        ERROR( "Unable to reference handle %p.\n",hFileMappingObject );
        goto InternalMapViewOfFileExit;
    }

    palError = pMappingObject->GetImmutableData(
        reinterpret_cast<void**>(&pImmutableData)
        );

    if (NO_ERROR != palError)
    {
        ERROR( "Unable to obtain object immutable data");
        goto InternalMapViewOfFileExit;
    }

    palError = pMappingObject->GetProcessLocalData(
        pThread,
        ReadLock,
        &pProcessLocalDataLock,
        reinterpret_cast<void**>(&pProcessLocalData)
        );

    if (NO_ERROR != palError)
    {
        ERROR( "Unable to obtain object process local data");
        goto InternalMapViewOfFileExit;
    }
    
    /* If dwNumberOfBytesToMap is 0, we need to map the entire file.
     * mmap doesn't do the same thing as Windows in that case, though,
     * so we use the file size instead. */
    if (0 == dwNumberOfBytesToMap)
    {
        dwNumberOfBytesToMap = pImmutableData->MaxSize;
    }

    palError = MAPDesiredAccessAllowed(
        pImmutableData->flProtect,
        dwDesiredAccess,
        pImmutableData->dwDesiredAccessWhenOpened
        );

    if (NO_ERROR != palError)
    {
        goto InternalMapViewOfFileExit;
    }

    InternalEnterCriticalSection(pThread, &mapping_critsec);

    if (FILE_MAP_COPY == dwDesiredAccess)
    {
        int flags = MAP_PRIVATE;

#if !HAVE_MMAP_DEV_ZERO
        if (pProcessLocalData->UnixFd == -1)
        {
            flags |= MAP_ANON;
        }
#endif
        pvBaseAddress = mmap(
            NULL,
            dwNumberOfBytesToMap,
            PROT_READ|PROT_WRITE,
            flags,
            pProcessLocalData->UnixFd,
            0
            );
    }
    else
    {
        INT prot = MAPFileMapToMmapFlags(dwDesiredAccess);
        if (prot != -1)
        {
            int flags = MAP_SHARED;

#if !HAVE_MMAP_DEV_ZERO
            if (pProcessLocalData->UnixFd == -1)
            {
                flags |= MAP_ANON;
            }
#endif

            pvBaseAddress = mmap(
                NULL,
                dwNumberOfBytesToMap,
                prot,
                flags,
                pProcessLocalData->UnixFd,
                0
                );

#if ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
            if ((MAP_FAILED == pvBaseAddress) && (ENOMEM == errno))
            {
                /* Search in list of MAPPED_MEMORY_INFO for a shared mapping 
                   with the same inode number
                */
                TRACE("Mmap() failed with errno=ENOMEM probably for multiple mapping "
                      "limitation. Searching for a replacement among existing mappings\n");

                pReusedMapping = FindSharedMappingReplacement(
                    pThread,
                    pProcessLocalData->MappedFileDevNum,
                    pProcessLocalData->MappedFileInodeNum,
                    dwNumberOfBytesToMap,
                    0
                    );
                
                if (pReusedMapping)
                {
                    int ret;

                    TRACE("Mapping @ %p {sz=%d offs=%d} fully "
                          "contains the requested one {sz=%d offs=%d}: reusing it\n",
                          pReusedMapping->pNMHolder->address,
                          (int)pReusedMapping->pNMHolder->size,
                          (int)pReusedMapping->pNMHolder->offset,
                          dwNumberOfBytesToMap, 0);

                    /* Let's check the mapping's current protection */
                    ret = mprotect(pReusedMapping->pNMHolder->address,
                                   pReusedMapping->pNMHolder->size,
                                   prot | PROT_CHECK);
                    if (0 != ret)
                    {               
                        /* We need to raise the protection to the desired 
                           one. That will give write access to any read-only
                           mapping sharing this native mapping, but there is 
                           no way around this problem on systems that do not
                           allow more than one mapping per file region, per
                           process */
                        TRACE("Raising protections on mapping @ %p to 0x%x\n",
                              pReusedMapping->pNMHolder->address, prot);
                        ret = mprotect(pReusedMapping->pNMHolder->address,
                                   pReusedMapping->pNMHolder->size,
                                   prot);
                    }

                    if (ret != 0) 
                    {
                        ERROR( "Failed setting protections on reused mapping\n");

                        NativeMapHolderRelease(pThread, pReusedMapping->pNMHolder);
                        InternalFree(pReusedMapping);
                        pReusedMapping = NULL;
                    }
                }
            }
#endif // ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
        }
        else
        {
            ASSERT( "MapFileMapToMmapFlags failed!\n" );
            palError = ERROR_INTERNAL_ERROR;
            goto InternalMapViewOfFileLeaveCriticalSection;
        }
    }

    if (MAP_FAILED == pvBaseAddress
#if ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
         &&  (pReusedMapping == NULL)
#endif // ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
        )
    {
        ERROR( "mmap failed with code %s.\n", strerror( errno ) );
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto InternalMapViewOfFileLeaveCriticalSection;

    }

#if ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
    if (pReusedMapping != NULL)
    {
        //
        // Add a reference to the file mapping object the reused mapping
        // points to (note that it may be different than the object this
        // call was actually made against) and add the view to the global
        // list. All other initialization took place in
        // FindSharedMappingReplacement
        //
        
        pvBaseAddress = pReusedMapping->lpAddress;
        pReusedMapping->pFileMapping->AddReference();
        InsertTailList(&MappedViewList, &pReusedMapping->Link);
    }
    else 
#endif // ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
    {
        //
        // Allocate and fill out a new view structure, and add it to
        // the global list.
        //
        
        PMAPPED_VIEW_LIST pNewView = (PMAPPED_VIEW_LIST)InternalMalloc(sizeof(*pNewView));
        if (NULL != pNewView)
        {
            pNewView->lpAddress = pvBaseAddress;
            pNewView->NumberOfBytesToMap = dwNumberOfBytesToMap;
            pNewView->dwDesiredAccess = dwDesiredAccess;
            pNewView->pFileMapping = pMappingObject;
            pNewView->pFileMapping->AddReference();
            pNewView->lpPEBaseAddress = 0;
            InsertTailList(&MappedViewList, &pNewView->Link);

#if ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
            pNewView->MappedFileDevNum = pProcessLocalData->MappedFileDevNum;
            pNewView->MappedFileInodeNum = pProcessLocalData->MappedFileInodeNum;
            
            pNewView->pNMHolder = NewNativeMapHolder(
                pThread,
                pvBaseAddress, 
                dwNumberOfBytesToMap,
                0,
                1
                );

            if (NULL == pNewView->pNMHolder)
            {
                pNewView->pFileMapping->ReleaseReference(pThread);
                RemoveEntryList(&pNewView->Link);
                InternalFree(pNewView);
                palError = ERROR_INTERNAL_ERROR;
            }
#endif // ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
        }
        else
        {
            palError = ERROR_INTERNAL_ERROR;
        }

        if (NO_ERROR != palError)
        {
            if (-1 == munmap(pvBaseAddress, dwNumberOfBytesToMap))
            {
                ERROR("Unable to unmap the file. Expect trouble.\n");
                goto InternalMapViewOfFileLeaveCriticalSection;
            }
        }
    }
    
    TRACE( "Added %p to the list.\n", pvBaseAddress );
    *ppvBaseAddress = pvBaseAddress;

InternalMapViewOfFileLeaveCriticalSection:

    InternalLeaveCriticalSection(pThread, &mapping_critsec);

InternalMapViewOfFileExit:

    if (NULL != pProcessLocalDataLock)
    {
        pProcessLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pMappingObject)
    {
        pMappingObject->ReleaseReference(pThread);
    }

    return palError;
}